

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_rw_hook_replace_unsafe(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  uint uVar1;
  int iVar2;
  intptr_t fd;
  uint8_t was_locked;
  int replaced;
  void *udata_local;
  fio_rw_hook_s *rw_hooks_local;
  intptr_t uuid_local;
  long lVar3;
  
  fd._4_4_ = -1;
  uVar1 = (uint)((ulong)uuid >> 8);
  lVar3 = (long)(int)uVar1;
  fio_rw_hook_validate(rw_hooks);
  iVar2 = fio_trylock((fio_lock_i *)((long)fio_data + lVar3 * 0xa8 + 0x6e));
  if (((-1 < uuid) && (uVar1 < fio_data->capa)) &&
     ((uuid & 0xffU) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
    *(fio_rw_hook_s **)((long)fio_data + lVar3 * 0xa8 + 0xa8) = rw_hooks;
    *(void **)((long)fio_data + lVar3 * 0xa8 + 0xb0) = udata;
    fd._4_4_ = 0;
  }
  if ((char)iVar2 == '\0') {
    fio_unlock((fio_lock_i *)((long)fio_data + lVar3 * 0xa8 + 0x6e));
  }
  return fd._4_4_;
}

Assistant:

int fio_rw_hook_replace_unsafe(intptr_t uuid, fio_rw_hook_s *rw_hooks,
                               void *udata) {
  int replaced = -1;
  uint8_t was_locked;
  intptr_t fd = fio_uuid2fd(uuid);
  fio_rw_hook_validate(rw_hooks);
  /* protect against some fulishness... but not all of it. */
  was_locked = fio_trylock(&fd_data(fd).sock_lock);
  if (uuid_is_valid(uuid)) {
    fd_data(fd).rw_hooks = rw_hooks;
    fd_data(fd).rw_udata = udata;
    replaced = 0;
  }
  if (!was_locked)
    fio_unlock(&fd_data(fd).sock_lock);
  return replaced;
}